

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Platform.cpp
# Opt level: O2

Platform * createPlatform(void)

{
  int iVar1;
  X11Platform *this;
  
  iVar1 = XInitThreads();
  if (iVar1 == 0) {
    de::throwRuntimeError
              ((char *)0x0,"XInitThreads() != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11Platform.cpp"
               ,0x62);
  }
  this = (X11Platform *)operator_new(0x68);
  tcu::x11::X11Platform::X11Platform(this);
  return &this->super_Platform;
}

Assistant:

tcu::Platform* createPlatform (void)
{
	// From man:XinitThreads(3):
	//
	//     The XInitThreads function initializes Xlib support for concurrent
	//     threads.  This function must be the first Xlib function
	//     a multi-threaded program calls, and it must complete before any other
	//     Xlib call is made.
	DE_CHECK_RUNTIME_ERR(XInitThreads() != 0);

	return new tcu::x11::X11Platform();
}